

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

void __thiscall FTraceInfo::SetSourcePosition(FTraceInfo *this)

{
  FTraceInfo *local_10;
  FTraceInfo *this_local;
  
  local_10 = this;
  TVector3<double>::operator=(&this->Results->SrcFromTarget,&this->Start);
  TVector3<double>::operator=(&this->Results->HitVector,&this->Vec);
  TVector3<double>::Angle((TVector3<double> *)&stack0xffffffffffffffe8);
  TAngle<double>::operator=
            (&this->Results->SrcAngleFromTarget,(TAngle<double> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void SetSourcePosition()
	{
		Results->SrcFromTarget = Start;
		Results->HitVector = Vec;
		Results->SrcAngleFromTarget = Results->HitVector.Angle();
	}